

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void vdbeSortSubtaskCleanup(sqlite3 *db,SortSubtask *pTask)

{
  long lVar1;
  long lVar2;
  sqlite3 *in_RSI;
  SorterRecord *in_RDI;
  sqlite3 *unaff_retaddr;
  void *in_stack_ffffffffffffffe8;
  
  sqlite3DbFree(in_RSI,in_stack_ffffffffffffffe8);
  lVar1._0_4_ = in_RSI->nDb;
  lVar1._4_4_ = in_RSI->mDbFlags;
  if (lVar1 == 0) {
    vdbeSorterRecordFree(unaff_retaddr,in_RDI);
  }
  else {
    sqlite3_free((void *)0x171d9b);
  }
  if (in_RSI->szMmap != 0) {
    sqlite3OsCloseFree((sqlite3_file *)0x171dc9);
  }
  lVar2._0_4_ = in_RSI->errCode;
  lVar2._4_4_ = in_RSI->errByteOffset;
  if (lVar2 != 0) {
    sqlite3OsCloseFree((sqlite3_file *)0x171de3);
  }
  memset(in_RSI,0,0x60);
  return;
}

Assistant:

static void vdbeSortSubtaskCleanup(sqlite3 *db, SortSubtask *pTask){
  sqlite3DbFree(db, pTask->pUnpacked);
#if SQLITE_MAX_WORKER_THREADS>0
  /* pTask->list.aMemory can only be non-zero if it was handed memory
  ** from the main thread.  That only occurs SQLITE_MAX_WORKER_THREADS>0 */
  if( pTask->list.aMemory ){
    sqlite3_free(pTask->list.aMemory);
  }else
#endif
  {
    assert( pTask->list.aMemory==0 );
    vdbeSorterRecordFree(0, pTask->list.pList);
  }
  if( pTask->file.pFd ){
    sqlite3OsCloseFree(pTask->file.pFd);
  }
  if( pTask->file2.pFd ){
    sqlite3OsCloseFree(pTask->file2.pFd);
  }
  memset(pTask, 0, sizeof(SortSubtask));
}